

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O1

bool __thiscall irr::gui::CGUIButton::OnEvent(CGUIButton *this,SEvent *event)

{
  bool bVar1;
  EEVENT_TYPE EVar2;
  int iVar3;
  EMOUSE_INPUT_EVENT EVar4;
  EGUI_EVENT_TYPE EVar5;
  int iVar6;
  long *plVar7;
  char cVar8;
  undefined1 uVar9;
  u32 uVar10;
  long lVar11;
  byte bVar12;
  undefined8 uVar13;
  SEvent newEvent;
  
  cVar8 = (**(code **)(*(long *)this + 0x90))();
  if (cVar8 != '\0') {
    EVar2 = event->EventType;
    if (EVar2 == EET_GUI_EVENT) {
      if ((CGUIButton *)(event->field_1).GUIEvent.Caller == this) {
        EVar5 = (event->field_1).GUIEvent.EventType;
        if (EVar5 - EGET_ELEMENT_HOVERED < 2) {
          uVar10 = os::Timer::getTime();
          this->HoverTime = uVar10;
        }
        else {
          if (EVar5 != EGET_ELEMENT_FOCUSED) {
            if (EVar5 != EGET_ELEMENT_FOCUS_LOST) goto LAB_00211b34;
            if (this->IsPushButton == false) {
              (**(code **)(*(long *)this + 0x1c0))(this,0);
            }
          }
          uVar10 = os::Timer::getTime();
          this->FocusTime = uVar10;
        }
      }
    }
    else {
      if (EVar2 == EET_MOUSE_INPUT_EVENT) {
        EVar4 = (event->field_1).MouseInput.Event;
        if (EVar4 == EMIE_LMOUSE_LEFT_UP) {
          iVar3 = (event->field_1).MouseInput.X;
          if ((((*(int *)&this->field_0x50 <= iVar3) &&
               (iVar6 = (event->field_1).MouseInput.Y, *(int *)&this->field_0x54 <= iVar6)) &&
              (iVar3 <= *(int *)&this->field_0x58)) && (iVar6 <= *(int *)&this->field_0x5c)) {
            bVar1 = this->Pressed;
            bVar12 = bVar1 ^ 1;
            (**(code **)(*(long *)this + 0x1c0))(this,this->IsPushButton & bVar12);
            if (*(long **)&this->field_0x20 == (long *)0x0 ||
                ((bVar12 | this->IsPushButton) & 1) != 0) {
              if (this->IsPushButton == false) {
                return true;
              }
              if (bVar1 == this->Pressed) {
                return true;
              }
            }
            this->ClickShiftState = (bool)((event->field_1).field13[0xc] & 1);
            this->ClickControlState = (bool)((byte)(event->field_1).field13[0xc] >> 1 & 1);
            (**(code **)(**(long **)&this->field_0x20 + 0x10))();
            return true;
          }
          if (this->IsPushButton != false) {
            return true;
          }
          lVar11 = *(long *)this;
          uVar13 = 0;
        }
        else {
          if (EVar4 != EMIE_LMOUSE_PRESSED_DOWN) goto LAB_00211b34;
          if (this->IsPushButton != false) {
            return true;
          }
          lVar11 = *(long *)this;
          uVar13 = 1;
        }
        (**(code **)(lVar11 + 0x1c0))(this,uVar13);
        return true;
      }
      if (EVar2 == EET_KEY_INPUT_EVENT) {
        bVar12 = (event->field_1).field13[0xc];
        if (((bVar12 & 1) == 0) ||
           ((iVar3 = (event->field_1).MouseInput.Y, iVar3 != 0x20 && (iVar3 != 0xd)))) {
          if ((this->Pressed != true) ||
             (((this->IsPushButton != false || ((bVar12 & 1) == 0)) ||
              ((event->field_1).MouseInput.Y != 0x1b)))) {
            if ((((bVar12 | ~this->Pressed) & 1) == 0) &&
               ((iVar3 = (event->field_1).MouseInput.Y, iVar3 == 0x20 || (iVar3 == 0xd)))) {
              if (this->IsPushButton == false) {
                (**(code **)(*(long *)this + 0x1c0))(this,0);
              }
              if (*(long **)&this->field_0x20 != (long *)0x0) {
                this->ClickShiftState = (bool)((byte)(event->field_1).field13[0xc] >> 1 & 1);
                this->ClickControlState = (bool)((byte)(event->field_1).field13[0xc] >> 2 & 1);
                (**(code **)(**(long **)&this->field_0x20 + 0x10))();
                return true;
              }
              return true;
            }
            goto LAB_00211b34;
          }
          lVar11 = *(long *)this;
          bVar12 = 0;
        }
        else if (this->IsPushButton == false) {
          lVar11 = *(long *)this;
          bVar12 = 1;
        }
        else {
          lVar11 = *(long *)this;
          bVar12 = this->Pressed ^ 1;
        }
        (**(code **)(lVar11 + 0x1c0))(this,bVar12);
        return true;
      }
    }
  }
LAB_00211b34:
  plVar7 = *(long **)&this->field_0x20;
  if (plVar7 != (long *)0x0) {
    uVar9 = (**(code **)(*plVar7 + 0x10))(plVar7,event);
    return (bool)uVar9;
  }
  return false;
}

Assistant:

bool CGUIButton::OnEvent(const SEvent &event)
{
	if (!isEnabled())
		return IGUIElement::OnEvent(event);

	switch (event.EventType) {
	case EET_KEY_INPUT_EVENT:
		if (event.KeyInput.PressedDown &&
				(event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {
			if (!IsPushButton)
				setPressed(true);
			else
				setPressed(!Pressed);

			return true;
		}
		if (Pressed && !IsPushButton && event.KeyInput.PressedDown && event.KeyInput.Key == KEY_ESCAPE) {
			setPressed(false);
			return true;
		} else if (!event.KeyInput.PressedDown && Pressed &&
				   (event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {

			if (!IsPushButton)
				setPressed(false);

			if (Parent) {
				ClickShiftState = event.KeyInput.Shift;
				ClickControlState = event.KeyInput.Control;

				SEvent newEvent;
				newEvent.EventType = EET_GUI_EVENT;
				newEvent.GUIEvent.Caller = this;
				newEvent.GUIEvent.Element = 0;
				newEvent.GUIEvent.EventType = EGET_BUTTON_CLICKED;
				Parent->OnEvent(newEvent);
			}
			return true;
		}
		break;
	case EET_GUI_EVENT:
		if (event.GUIEvent.Caller == this) {
			if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) {
				if (!IsPushButton)
					setPressed(false);
				FocusTime = os::Timer::getTime();
			} else if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUSED) {
				FocusTime = os::Timer::getTime();
			} else if (event.GUIEvent.EventType == EGET_ELEMENT_HOVERED || event.GUIEvent.EventType == EGET_ELEMENT_LEFT) {
				HoverTime = os::Timer::getTime();
			}
		}
		break;
	case EET_MOUSE_INPUT_EVENT:
		if (event.MouseInput.Event == EMIE_LMOUSE_PRESSED_DOWN) {
			if (!IsPushButton)
				setPressed(true);

			return true;
		} else if (event.MouseInput.Event == EMIE_LMOUSE_LEFT_UP) {
			bool wasPressed = Pressed;

			if (!AbsoluteClippingRect.isPointInside(core::position2d<s32>(event.MouseInput.X, event.MouseInput.Y))) {
				if (!IsPushButton)
					setPressed(false);
				return true;
			}

			if (!IsPushButton)
				setPressed(false);
			else {
				setPressed(!Pressed);
			}

			if ((!IsPushButton && wasPressed && Parent) ||
					(IsPushButton && wasPressed != Pressed)) {
				ClickShiftState = event.MouseInput.Shift;
				ClickControlState = event.MouseInput.Control;

				SEvent newEvent;
				newEvent.EventType = EET_GUI_EVENT;
				newEvent.GUIEvent.Caller = this;
				newEvent.GUIEvent.Element = 0;
				newEvent.GUIEvent.EventType = EGET_BUTTON_CLICKED;
				Parent->OnEvent(newEvent);
			}

			return true;
		}
		break;
	default:
		break;
	}

	return Parent ? Parent->OnEvent(event) : false;
}